

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

double NEST::NESTcalc::GetDriftVelocity_Liquid
                 (double Kelvin,double eField,double Density,double Bar,short StdDev)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  ostream *poVar6;
  runtime_error *this;
  int iVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double __x;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double local_80;
  
  bVar5 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (bVar5) {
    if ((Kelvin < 84.0) || (140.0 < Kelvin)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\nWARNING: TEMPERATURE OUT OF RANGE (84-140 K) for vD\n",
                 0x35);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Using value at closest temp for a drift speed estimate\n",
                 0x37);
      iVar7 = 0x54;
      if (0x54 < (int)Kelvin) {
        iVar7 = (int)Kelvin;
      }
      if (0x8b < iVar7) {
        iVar7 = 0x8c;
      }
      Kelvin = (double)iVar7;
    }
    if ((Kelvin < 85.0) || (86.0 <= Kelvin)) {
      if ((Kelvin < 86.0) || (88.0 <= Kelvin)) {
        if ((Kelvin < 88.0) || (92.0 <= Kelvin)) {
          if ((Kelvin < 92.0) || (96.0 <= Kelvin)) {
            if ((Kelvin < 96.0) || (110.0 <= Kelvin)) {
              if ((Kelvin < 110.0) || (125.0 <= Kelvin)) {
                uVar12 = 0;
                uVar13 = 0;
                if ((Kelvin < 125.0) || (140.0 < Kelvin)) goto LAB_001105df;
                local_80 = -0.03558428 / (eField / 1000.0) + 0.24207633;
                dVar15 = log(eField / 1000.0);
                dVar15 = dVar15 * 0.33645519;
              }
              else {
                local_80 = -0.06644517 / (eField / 1000.0) + 0.502022794;
                dVar15 = log(eField / 1000.0);
                dVar15 = dVar15 * 0.3290246;
              }
            }
            else {
              local_80 = -0.0731659 / (eField / 1000.0) + 0.76551511;
              dVar15 = log(eField / 1000.0);
              dVar15 = dVar15 * 0.317972;
            }
          }
          else {
            local_80 = -0.092997 / (eField / 1000.0) + 0.6911897;
            dVar15 = log(eField / 1000.0);
            dVar15 = dVar15 * 0.3295202;
          }
        }
        else {
          local_80 = -0.0990952 / (eField / 1000.0) + 0.7795972;
          dVar15 = log(eField / 1000.0);
          dVar15 = dVar15 * 0.320876;
        }
      }
      else {
        local_80 = -0.06694564 / (eField / 1000.0) + 0.80302379;
        dVar15 = log(eField / 1000.0);
        dVar15 = dVar15 * 0.331798;
      }
    }
    else {
      local_80 = -0.0734108 / (eField / 1000.0) + 0.937729;
      dVar15 = log(eField / 1000.0);
      dVar15 = dVar15 * 0.315338;
    }
    dVar15 = exp(dVar15 + local_80);
    uVar12 = SUB84(dVar15,0);
    uVar13 = (undefined4)((ulong)dVar15 >> 0x20);
LAB_001105df:
    dVar15 = 0.0;
    if (0.0 <= (double)CONCAT44(uVar13,uVar12)) {
      dVar15 = (double)CONCAT44(uVar13,uVar12);
    }
    return dVar15;
  }
  if (0 < StdDev) {
    dVar15 = pow(eField / 30.0,1.3);
    dVar14 = 1.83;
LAB_00110072:
    return dVar14 - dVar14 / (dVar15 + 1.0);
  }
  if (-1 < StdDev) {
    dVar15 = pow(eField / 31.683,1.3237);
    dVar14 = 1.7681;
    goto LAB_00110072;
  }
  if ((Kelvin < 100.0) || (230.0 < Kelvin)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\nWARNING: TEMPERATURE OUT OF RANGE (100-230 K) for vD\n",0x36
              );
    dVar15 = 100.0;
    if (100.0 <= Kelvin) {
      dVar15 = Kelvin;
    }
    Kelvin = 230.0;
    if (dVar15 <= 230.0) {
      Kelvin = dVar15;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Using value at closest temp for a drift speed estimate\n",0x37
              );
  }
  if (((((((Kelvin < 100.0) || (lVar8 = 0, 120.0 <= Kelvin)) &&
         ((Kelvin < 120.0 || (lVar8 = 1, 140.0 <= Kelvin)))) &&
        ((Kelvin < 140.0 || (lVar8 = 2, 155.0 <= Kelvin)))) &&
       (((Kelvin < 155.0 || (lVar8 = 3, 157.0 <= Kelvin)) &&
        ((((Kelvin < 157.0 || (lVar8 = 4, 163.0 <= Kelvin)) &&
          ((Kelvin < 163.0 || (lVar8 = 5, 165.0 <= Kelvin)))) &&
         ((Kelvin < 165.0 || (lVar8 = 6, 167.0 <= Kelvin)))))))) &&
      ((Kelvin < 167.0 || (lVar8 = 7, 184.0 <= Kelvin)))) &&
     (((Kelvin < 184.0 || (lVar8 = 8, 200.0 <= Kelvin)) &&
      ((Kelvin < 200.0 || (lVar8 = 9, 230.0 < Kelvin)))))) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"ERROR: TEMPERATURE OUT OF RANGE (100-230 K)");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar9 = (ulong)((int)lVar8 + 1);
  dVar15 = (double)(&DAT_00116cc0)[lVar8];
  dVar14 = (double)(&DAT_00116cc0)[uVar9];
  lVar11 = lVar8 * 0x38;
  dVar18 = -eField;
  dVar16 = exp(dVar18 / (double)(&DAT_00116a58)[lVar8 * 7]);
  dVar2 = exp(dVar18 / *(double *)(&UNK_00116a68 + lVar11));
  dVar1 = *(double *)(&UNK_00116a60 + lVar11);
  dVar17 = *(double *)(&DAT_00116a50 + lVar11);
  dVar3 = exp(dVar18 / *(double *)(&UNK_00116a78 + lVar11));
  dVar16 = dVar3 * *(double *)(&UNK_00116a70 + lVar11) + dVar16 * dVar17 + dVar2 * dVar1 +
           *(double *)(&UNK_00116a80 + lVar11);
  lVar8 = uVar9 * 0x38;
  dVar2 = exp(dVar18 / (double)(&DAT_00116a58)[uVar9 * 7]);
  dVar3 = exp(dVar18 / *(double *)(&UNK_00116a68 + lVar8));
  dVar1 = *(double *)(&UNK_00116a60 + lVar8);
  dVar17 = *(double *)(&DAT_00116a50 + lVar8);
  dVar18 = exp(dVar18 / *(double *)(&UNK_00116a78 + lVar8));
  dVar1 = dVar18 * *(double *)(&UNK_00116a70 + lVar8) + dVar2 * dVar17 + dVar3 * dVar1 +
          *(double *)(&UNK_00116a80 + lVar8);
  bVar5 = ValidityTests::nearlyEqual(Kelvin,dVar15,1e-09);
  if (bVar5) {
    return dVar16;
  }
  bVar5 = ValidityTests::nearlyEqual(Kelvin,dVar14,1e-09);
  if (bVar5) {
    return dVar1;
  }
  dVar17 = dVar1 - dVar16;
  if (dVar16 <= dVar1) {
    dVar15 = (Kelvin - dVar15) * (dVar17 / (dVar14 - dVar15));
  }
  else {
    dVar18 = ((dVar14 * dVar17 - dVar17 * dVar15) + -4.0) * dVar17;
    if (dVar18 < 0.0) {
      dVar2 = sqrt(dVar18);
    }
    else {
      dVar2 = SQRT(dVar18);
    }
    __x = dVar14 - dVar15;
    dVar19 = SQRT(__x);
    dVar3 = dVar19;
    if (__x < 0.0) {
      dVar3 = sqrt(__x);
    }
    dVar4 = dVar19;
    if (__x < 0.0) {
      dVar4 = sqrt(__x);
    }
    if (__x < 0.0) {
      dVar19 = sqrt(__x);
    }
    dVar16 = ((dVar16 + dVar1) * dVar3 + dVar2) / (dVar4 + dVar4);
    if (dVar18 < 0.0) {
      dVar18 = sqrt(dVar18);
    }
    else {
      dVar18 = SQRT(dVar18);
    }
    dVar15 = 1.0 / ((dVar19 * dVar18 - (dVar15 + dVar14) * dVar17) / (dVar17 + dVar17) + Kelvin);
  }
  if (0.0 < dVar16 + dVar15) {
    return dVar16 + dVar15;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nWARNING: DRIFT SPEED NON-POSITIVE. Setting to 0.1 mm/us\t",
             0x39);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "Line Number ~1950 of NEST.cpp, in function NESTcalc::GetDriftVelocity_Liquid\t",0x4d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "Stop bothering Matthew about this, and fix underlying cause in your code!\n",0x4a);
  if ((100.0 <= eField) || (eField < 1.0)) {
    if (eField <= 10000.0) {
      pcVar10 = "Something unknown went wrong: are you in a noble element?? ";
      lVar8 = 0x3b;
      goto LAB_001107e9;
    }
    pcVar10 = "FIELD MAYBE TOO HIGH. ";
  }
  else {
    pcVar10 = "FIELD MAY BE TOO LOW. ";
  }
  lVar8 = 0x16;
LAB_001107e9:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,lVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"EF = ",5);
  poVar6 = std::ostream::_M_insert<double>(eField);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," V/cm. T = ",0xb);
  poVar6 = std::ostream::_M_insert<double>(Kelvin);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," Kelvin",7);
  std::endl<char,std::char_traits<char>>(poVar6);
  return 0.1;
}

Assistant:

double NESTcalc::GetDriftVelocity_Liquid(double Kelvin, double eField, double Density,
                                         double Bar, short int StdDev) {
  // for liquid and solid only. Density and purity dependencies to be
  // added in the future.

  double speed =
      0.0;  // returns drift speed in mm/usec. based on Fig. 14 arXiv:1712.08607
  int i, j;
  double vi, vf, slope, Ti, Tf, offset;

  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.)) {
    // replace eventually with Kate's work, once T's splined as done for LXe and
    // SXe
    /*x_nest is field in kV/cm:
    Liquid:
    y_nest_85 = 2.553969*(0.929235**(1/x_nest))*x_nest**0.315673 // temperatures
    in Kelvin y_nest_87 = 2.189388*(0.961701**(1/x_nest))*x_nest**0.339414
    y_nest_89 = 2.201489*(0.931080**(1/x_nest))*x_nest**0.320762
    y_nest_94 = 1.984534*(0.936081**(1/x_nest))*x_nest**0.332491
    y_nest_100 = 2.150101*(0.929447**(1/x_nest))*x_nest**0.317973
    y_nest_120 = 1.652059*(0.935714**(1/x_nest))*x_nest**0.329025
    y_nest_130 = 1.273891*(0.965041**(1/x_nest))*x_nest**0.336455
    Solid:
    y_nest_80 = 7.063288*(0.929753**(1/x_nest))*x_nest**0.314640
    y_nest_82 = 5.093097*(0.920459**(1/x_nest))*x_nest**0.458724*/
    double Temperature[8] = {85., 86., 88., 92., 96., 110., 125., 140.};

    if (Kelvin < 84. || Kelvin > 140.) {
      cerr << "\nWARNING: TEMPERATURE OUT OF RANGE (84-140 K) for vD\n";
      cerr << "Using value at closest temp for a drift speed estimate\n";
      Kelvin = (double)NESTcalc::clamp(int(Kelvin), 84, 140);
    }
	//if (Kelvin==89) speed =  2.201489*pow(0.931080,1/(eField/1000))*pow((eField/1000), 0.320762);
   if (Kelvin >= Temperature[0] && Kelvin < Temperature[1])
      speed = exp(0.937729 - 0.0734108 / (eField / 1000) +
                  0.315338 * log(eField / 1000));
    else if (Kelvin >= Temperature[1] && Kelvin < Temperature[2])
      speed = exp(0.80302379 - 0.06694564 / (eField / 1000) +
                  0.331798 * log(eField / 1000));
    else if (Kelvin >= Temperature[2] && Kelvin < Temperature[3])
      speed = exp(0.7795972 - 0.0990952 / (eField / 1000) +
                  0.320876 * log(eField / 1000));
    else if (Kelvin >= Temperature[3] && Kelvin < Temperature[4])
      speed = exp(0.6911897 - 0.092997 / (eField / 1000) +
                  0.3295202 * log(eField / 1000));
    else if (Kelvin >= Temperature[4] && Kelvin < Temperature[5])
      speed = exp(0.76551511 - 0.0731659 / (eField / 1000) +
                  0.317972 * log(eField / 1000));
    else if (Kelvin >= Temperature[5] && Kelvin < Temperature[6])
      speed = exp(0.502022794 - 0.06644517 / (eField / 1000) +
                  0.3290246 * log(eField / 1000));
    else if (Kelvin >= Temperature[6] && Kelvin <= Temperature[7])
      speed = exp(0.24207633 - 0.03558428 / (eField / 1000) +
                  0.33645519 * log(eField / 1000));

    if (speed < 0.) speed = 0.;
    return speed;
  }

  if (StdDev >= 1)
    return 1.83 - 1.83 / (1. + pow(eField / 30., 1.3));  // eF<260V/cm
  if (StdDev >= 0) return 1.7681 - 1.7681 / (1. + pow(eField / 31.683, 1.3237));

  double polyExp[11][7] = {
      {-3.1046, 27.037, -2.1668, 193.27, -4.8024, 646.04, 9.2471},  // 100K
      {-2.7394, 22.760, -1.7775, 222.72, -5.0836, 724.98, 8.7189},  // 120
      {-2.3646, 164.91, -1.6984, 21.473, -4.4752, 1202.2, 7.9744},  // 140
      {-1.8097, 235.65, -1.7621, 36.855, -3.5925, 1356.2, 6.7865},  // 155
      {-1.5000, 37.021, -1.1430, 6.4590, -4.0337, 855.43,
       5.4238},  // 157, merging Miller with Yoo
      {-1.4939, 47.879, 0.12608, 8.9095, -1.3480, 1310.9,
       2.7598},  // 163, merging Miller with Yoo
      {-1.5389, 26.602, -.44589, 196.08, -1.1516, 1810.8, 2.8912},  // 165
      {-1.5000, 28.510, -.21948, 183.49, -1.4320, 1652.9, 2.884},   // 167
      {-1.1781, 49.072, -1.3008, 3438.4, -.14817, 312.12, 2.8049},  // 184
      {1.2466, 85.975, -.88005, 918.57, -3.0085, 27.568, 2.3823},   // 200
      {334.60, 37.556, 0.92211, 345.27, -338.00, 37.346, 1.9834}};  // 230

  double Temperatures[11] = {100., 120., 140., 155., 157., 163.,
                             165., 167., 184., 200., 230.};

  if (Kelvin < 100. || Kelvin > 230.) {
    cerr << "\nWARNING: TEMPERATURE OUT OF RANGE (100-230 K) for vD\n";
    if (Kelvin < 100.) Kelvin = 100.;
    if (Kelvin > 230.) Kelvin = 230.;
    cerr << "Using value at closest temp for a drift speed estimate\n";
  }

  if (Kelvin >= Temperatures[0] && Kelvin < Temperatures[1])
    i = 0;
  else if (Kelvin >= Temperatures[1] && Kelvin < Temperatures[2])
    i = 1;
  else if (Kelvin >= Temperatures[2] && Kelvin < Temperatures[3])
    i = 2;
  else if (Kelvin >= Temperatures[3] && Kelvin < Temperatures[4])
    i = 3;
  else if (Kelvin >= Temperatures[4] && Kelvin < Temperatures[5])
    i = 4;
  else if (Kelvin >= Temperatures[5] && Kelvin < Temperatures[6])
    i = 5;
  else if (Kelvin >= Temperatures[6] && Kelvin < Temperatures[7])
    i = 6;
  else if (Kelvin >= Temperatures[7] && Kelvin < Temperatures[8])
    i = 7;
  else if (Kelvin >= Temperatures[8] && Kelvin < Temperatures[9])
    i = 8;
  else if (Kelvin >= Temperatures[9] && Kelvin <= Temperatures[10])
    i = 9;
  else {
    throw std::runtime_error("ERROR: TEMPERATURE OUT OF RANGE (100-230 K)");
  }

  j = i + 1;
  Ti = Temperatures[i];
  Tf = Temperatures[j];
  // functional form from http://zunzun.com
  vi = polyExp[i][0] * exp(-eField / polyExp[i][1]) +
       polyExp[i][2] * exp(-eField / polyExp[i][3]) +
       polyExp[i][4] * exp(-eField / polyExp[i][5]) + polyExp[i][6];
  vf = polyExp[j][0] * exp(-eField / polyExp[j][1]) +
       polyExp[j][2] * exp(-eField / polyExp[j][3]) +
       polyExp[j][4] * exp(-eField / polyExp[j][5]) + polyExp[j][6];
  if (ValidityTests::nearlyEqual(Kelvin, Ti)) return vi;
  if (ValidityTests::nearlyEqual(Kelvin, Tf)) return vf;
  if (vf < vi) {
    offset = (sqrt((Tf * (vf - vi) - Ti * (vf - vi) - 4.) * (vf - vi)) +
              sqrt(Tf - Ti) * (vf + vi)) /
             (2. * sqrt(Tf - Ti));
    slope = -(sqrt(Tf - Ti) *
                  sqrt((Tf * (vf - vi) - Ti * (vf - vi) - 4.) * (vf - vi)) -
              (Tf + Ti) * (vf - vi)) /
            (2. * (vf - vi));
    speed = 1. / (Kelvin - slope) + offset;
  } else {
    slope = (vf - vi) / (Tf - Ti);
    speed = slope * (Kelvin - Ti) + vi;
  }

  if (speed <= 0.) {
    cerr << "\nWARNING: DRIFT SPEED NON-POSITIVE. Setting to 0.1 mm/us\t"
         << "Line Number ~1950 of NEST.cpp, in function "
            "NESTcalc::GetDriftVelocity_Liquid\t"
         << "Stop bothering Matthew about this, and fix underlying cause in "
            "your code!\n";
    if (eField < 1e2 && eField >= FIELD_MIN) {
      cerr << "FIELD MAY BE TOO LOW. ";
    } else if (eField > 1e4) {
      cerr << "FIELD MAYBE TOO HIGH. ";
    } else {
      cerr << "Something unknown went wrong: are you in a noble element?? ";
    }
    cerr << "EF = " << eField << " V/cm. T = " << Kelvin << " Kelvin" << endl;
    speed = 0.1;
  }
  return speed;  // mm per microsecond
}